

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
TwoValuesWithHashCollision_LevelTenCollisionInsert_Test::
~TwoValuesWithHashCollision_LevelTenCollisionInsert_Test
          (TwoValuesWithHashCollision_LevelTenCollisionInsert_Test *this)

{
  TwoValuesWithHashCollision_LevelTenCollisionInsert_Test *this_local;
  
  ~TwoValuesWithHashCollision_LevelTenCollisionInsert_Test(this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelTenCollisionInsert) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_->insert (t1, std::make_pair ("f"s, "value f"s));
    std::pair<test_trie::iterator, bool> itp =
        index_->insert (t1, std::make_pair ("e"s, "value e"s));
    EXPECT_TRUE (itp.second);
    std::string const & v = (*itp.first).second;
    EXPECT_EQ ("value e", v);

    itp = index_->insert (t1, std::make_pair ("e"s, "new value e"s));
    EXPECT_FALSE (itp.second);
    std::string const & v1 = (*itp.first).second;
    EXPECT_EQ ("value e", v1);
}